

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

ssize_t archive_write_mtree_data(archive_write *a,void *buff,size_t n)

{
  long *plVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  
  plVar1 = (long *)a->format_data;
  uVar2 = plVar1[0xf];
  if (uVar2 < n) {
    n = uVar2;
  }
  plVar1[0xf] = uVar2 - n;
  if ((*plVar1 != 0) && (*(int *)(*plVar1 + 0xe4) == 0x8000)) {
    if ((*(uint *)(plVar1 + 0x1c) & 1) != 0) {
      if (n != 0) {
        uVar4 = *(uint *)((long)plVar1 + 0xe4);
        sVar3 = 0;
        do {
          uVar4 = uVar4 << 8 ^ crctab[(uint)*(byte *)((long)buff + sVar3) ^ uVar4 >> 0x18];
          *(uint *)((long)plVar1 + 0xe4) = uVar4;
          sVar3 = sVar3 + 1;
        } while (n != sVar3);
      }
      plVar1[0x1d] = plVar1[0x1d] + n;
    }
    if ((*(uint *)(plVar1 + 0x1c) >> 8 & 1) != 0) {
      __archive_md5update((archive_md5_ctx *)(plVar1 + 0x1e),buff,n);
    }
    if ((*(byte *)((long)plVar1 + 0xe1) & 0x20) != 0) {
      __archive_ripemd160update((archive_rmd160_ctx *)(plVar1 + 0x1f),buff,n);
    }
    if ((*(byte *)((long)plVar1 + 0xe1) & 0x40) != 0) {
      __archive_sha1update((archive_sha1_ctx *)(plVar1 + 0x20),buff,n);
    }
    if ((*(byte *)((long)plVar1 + 0xe2) & 0x80) != 0) {
      __archive_sha256update((archive_sha256_ctx *)(plVar1 + 0x21),buff,n);
    }
    if ((*(byte *)((long)plVar1 + 0xe3) & 1) != 0) {
      __archive_sha384update((archive_sha384_ctx *)(plVar1 + 0x22),buff,n);
    }
    if ((*(byte *)((long)plVar1 + 0xe3) & 2) != 0) {
      __archive_sha512update((archive_sha512_ctx *)(plVar1 + 0x23),buff,n);
    }
  }
  return n;
}

Assistant:

static ssize_t
archive_write_mtree_data(struct archive_write *a, const void *buff, size_t n)
{
	struct mtree_writer *mtree= a->format_data;

	if (n > mtree->entry_bytes_remaining)
		n = (size_t)mtree->entry_bytes_remaining;
	mtree->entry_bytes_remaining -= n;

	/* We don't need to compute a regular file sum */
	if (mtree->mtree_entry == NULL)
		return (n);

	if (mtree->mtree_entry->filetype == AE_IFREG)
		sum_update(mtree, buff, n);

	return (n);
}